

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void HMAC_SHA256_Final_Y(uchar *digest,HMAC_SHA256_CTX_Y *ctx)

{
  SHA256_CTX_Y *in_RSI;
  uchar ihash [32];
  SHA256_CTX_Y *in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  
  SHA256_Final_Y(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SHA256_Update_Y(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  SHA256_Final_Y(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  memset(&stack0xffffffffffffffc8,0,0x20);
  return;
}

Assistant:

void
HMAC_SHA256_Final_Y(unsigned char digest[32], HMAC_SHA256_CTX_Y * ctx)
{
	unsigned char ihash[32];

	/* Finish the inner SHA256 operation. */
	SHA256_Final_Y(ihash, &ctx->ictx);

	/* Feed the inner hash to the outer SHA256 operation. */
	SHA256_Update_Y(&ctx->octx, ihash, 32);

	/* Finish the outer SHA256 operation. */
	SHA256_Final_Y(digest, &ctx->octx);

	/* Clean the stack. */
	memset(ihash, 0, 32);
}